

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void parserDoubleLinkSelect(Parse *pParse,Select *p)

{
  int iVar1;
  Select *pSVar2;
  char *pcVar3;
  char *pcVar4;
  int local_30;
  int cnt;
  int mxSelect;
  Select *pLoop;
  Select *pNext;
  Select *p_local;
  Parse *pParse_local;
  
  if (p->pPrior != (Select *)0x0) {
    pLoop = (Select *)0x0;
    local_30 = 1;
    pSVar2 = p;
    do {
      _cnt = pSVar2;
      _cnt->pNext = pLoop;
      _cnt->selFlags = _cnt->selFlags | 0x100;
      pLoop = _cnt;
      pSVar2 = _cnt->pPrior;
      if (pSVar2 == (Select *)0x0) goto LAB_00184534;
      local_30 = local_30 + 1;
    } while ((pSVar2->pOrderBy == (ExprList *)0x0) && (pSVar2->pLimit == (Expr *)0x0));
    pcVar3 = "LIMIT";
    if (pSVar2->pOrderBy != (ExprList *)0x0) {
      pcVar3 = "ORDER BY";
    }
    pcVar4 = sqlite3SelectOpName((uint)_cnt->op);
    sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",pcVar3,pcVar4);
LAB_00184534:
    if ((((p->selFlags & 0x400) == 0) && (iVar1 = pParse->db->aLimit[4], 0 < iVar1)) &&
       (iVar1 < local_30)) {
      sqlite3ErrorMsg(pParse,"too many terms in compound SELECT");
    }
  }
  return;
}

Assistant:

static void parserDoubleLinkSelect(Parse *pParse, Select *p){
    assert( p!=0 );
    if( p->pPrior ){
      Select *pNext = 0, *pLoop = p;
      int mxSelect, cnt = 1;
      while(1){
        pLoop->pNext = pNext;
        pLoop->selFlags |= SF_Compound;
        pNext = pLoop;
        pLoop = pLoop->pPrior;
        if( pLoop==0 ) break;
        cnt++;
        if( pLoop->pOrderBy || pLoop->pLimit ){
          sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",
             pLoop->pOrderBy!=0 ? "ORDER BY" : "LIMIT",
             sqlite3SelectOpName(pNext->op));
          break;
        }
      }
      if( (p->selFlags & SF_MultiValue)==0 &&
        (mxSelect = pParse->db->aLimit[SQLITE_LIMIT_COMPOUND_SELECT])>0 &&
        cnt>mxSelect
      ){
        sqlite3ErrorMsg(pParse, "too many terms in compound SELECT");
      }
    }
  }